

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O2

bool __thiscall draco::ObjEncoder::IsNewEdge(ObjEncoder *this,CornerTable *ct,CornerIndex ci)

{
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> point_index;
  uint8_t value;
  
  if ((int)ci.value_ < 0) {
    point_index.value_ = 0xffffffff;
  }
  else {
    point_index.value_ =
         (this->in_mesh_->faces_).vector_.
         super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
         ._M_impl.super__Vector_impl_data._M_start[(ulong)ci.value_ / 3]._M_elems
         [(ulong)ci.value_ % 3].value_;
  }
  if (this->added_edges_att_ != (PointAttribute *)0x0) {
    PointAttribute::GetMappedValue(this->added_edges_att_,(PointIndex)point_index.value_,&value);
    return value == '\x01';
  }
  return false;
}

Assistant:

inline PointIndex CornerToPointId(int ci) const {
    if (ci < 0 || static_cast<uint32_t>(ci) == kInvalidCornerIndex.value()) {
      return kInvalidPointIndex;
    }
    return this->face(FaceIndex(ci / 3))[ci % 3];
  }